

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O0

range_t * __thiscall pool_layer_t::map_to_output(pool_layer_t *this,int x,int y)

{
  layer_type lVar1;
  int iVar2;
  long in_RSI;
  pool_layer_t *in_RDI;
  float b;
  float a;
  bool in_stack_ffffffffffffffcf;
  pool_layer_t *this_00;
  
  this_00 = in_RDI;
  lVar1 = normalize_range(in_RDI,(float)((ulong)in_RSI >> 0x20),(int)in_RSI,
                          in_stack_ffffffffffffffcf);
  (this_00->super_layer_t).type = lVar1;
  iVar2 = normalize_range(this_00,(float)((ulong)in_RSI >> 0x20),(int)in_RSI,
                          in_stack_ffffffffffffffcf);
  *(int *)&(this_00->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar2;
  *(undefined4 *)
   ((long)&(this_00->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  iVar2 = normalize_range(this_00,(float)((ulong)in_RSI >> 0x20),(int)in_RSI,
                          in_stack_ffffffffffffffcf);
  *(int *)&(this_00->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish = iVar2;
  iVar2 = normalize_range(this_00,(float)((ulong)in_RSI >> 0x20),(int)in_RSI,
                          in_stack_ffffffffffffffcf);
  *(int *)((long)&(this_00->super_layer_t).grads_in.data.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_finish + 4) = iVar2;
  *(int *)&(this_00->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage = *(int *)(in_RSI + 0x74) + -1;
  return (range_t *)in_RDI;
}

Assistant:

range_t map_to_output(int x, int y) {
    float a = x;
    float b = y;
    return
        {
            normalize_range((a - extend_filter + 1) / stride, out.size.x, true),
            normalize_range((b - extend_filter + 1) / stride, out.size.y, true),
            0,
            normalize_range(a / stride, out.size.x, false),
            normalize_range(b / stride, out.size.y, false),
            (int) out.size.z - 1,
        };
  }